

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)17>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  uint uVar2;
  uint6 uVar3;
  long lVar4;
  float fVar5;
  
  if (0 < count) {
    lVar4 = 0;
    do {
      uVar2 = *(uint *)(src + lVar4 + (long)index * 4);
      uVar3 = CONCAT24((short)(uVar2 >> 8),uVar2) & 0xff000000ff;
      fVar5 = (float)(uVar2 >> 0x18) * 0.003921569;
      pfVar1 = &buffer->r + lVar4;
      *pfVar1 = fVar5 * (float)(int)uVar3 * 0.003921569;
      pfVar1[1] = fVar5 * (float)(ushort)(uVar3 >> 0x20) * 0.003921569;
      pfVar1[2] = (float)(uVar2 >> 0x10 & 0xff) * 0.003921569 * fVar5;
      pfVar1[3] = fVar5;
      lVar4 = lVar4 + 4;
    } while ((ulong)(uint)count << 2 != lVar4);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}